

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O1

LY_ERR ly_vprint_(ly_out *out,char *format,__va_list_tag *ap)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  LY_ERR LVar5;
  ulong uVar6;
  char *msg;
  char *local_28;
  
  local_28 = (char *)0x0;
  switch(out->type) {
  case LY_OUT_FD:
    uVar1 = vdprintf((out->method).fd,format,ap);
    break;
  case LY_OUT_FDSTREAM:
  case LY_OUT_FILE:
  case LY_OUT_FILEPATH:
    uVar1 = vfprintf((FILE *)(out->method).f,format,ap);
    break;
  case LY_OUT_MEMORY:
    uVar1 = vasprintf(&local_28,format,ap);
    if ((int)uVar1 < 0) break;
    uVar6 = (ulong)uVar1;
    pcVar4 = (out->method).fpath.filepath + uVar6 + 1;
    if ((char *)(out->method).mem.size < pcVar4) {
      pcVar4 = (char *)ly_realloc(*(out->method).mem.buf,(size_t)pcVar4);
      *(out->method).mem.buf = pcVar4;
      if (*(out->method).mem.buf == (char *)0x0) {
        (out->method).fpath.filepath = (char *)0x0;
        (out->method).mem.size = 0;
        free(local_28);
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vprint_");
        return LY_EMEM;
      }
      (out->method).mem.size = (size_t)((out->method).fpath.filepath + uVar6 + 1);
    }
    if (uVar1 != 0) {
      memcpy(*(out->method).mem.buf + (long)(out->method).fpath.filepath,local_28,uVar6);
    }
    pcVar4 = (out->method).fpath.filepath + uVar6;
    (out->method).fpath.filepath = pcVar4;
    (*(out->method).mem.buf)[(long)pcVar4] = '\0';
    goto LAB_0013bccc;
  case LY_OUT_CALLBACK:
    uVar1 = vasprintf(&local_28,format,ap);
    if ((int)uVar1 < 0) break;
    sVar2 = (*(out->method).clb.func)((out->method).fpath.filepath,local_28,(size_t)uVar1);
    uVar1 = (uint)sVar2;
LAB_0013bccc:
    free(local_28);
    break;
  case LY_OUT_ERROR:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x1e2);
    return LY_EINT;
  default:
    uVar1 = 0;
  }
  if ((int)uVar1 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    uVar6 = 0;
    LVar5 = LY_ESYS;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"%s: writing data failed (%s).","ly_vprint_",pcVar4);
  }
  else {
    if (out->type == LY_OUT_FDSTREAM) {
      lseek((out->method).fdstream.fd,0,2);
    }
    uVar6 = (ulong)uVar1;
    LVar5 = LY_SUCCESS;
  }
  out->printed = out->printed + uVar6;
  out->func_printed = out->func_printed + uVar6;
  return LVar5;
}

Assistant:

static LY_ERR
ly_vprint_(struct ly_out *out, const char *format, va_list ap)
{
    LY_ERR ret;
    int written = 0;
    char *msg = NULL;

    switch (out->type) {
    case LY_OUT_FD:
        written = vdprintf(out->method.fd, format, ap);
        break;
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
        written = vfprintf(out->method.f, format, ap);
        break;
    case LY_OUT_MEMORY:
        if ((written = vasprintf(&msg, format, ap)) < 0) {
            break;
        }
        if (out->method.mem.len + written + 1 > out->method.mem.size) {
            *out->method.mem.buf = ly_realloc(*out->method.mem.buf, out->method.mem.len + written + 1);
            if (!*out->method.mem.buf) {
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                free(msg);
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->method.mem.size = out->method.mem.len + written + 1;
        }
        if (written) {
            memcpy(&(*out->method.mem.buf)[out->method.mem.len], msg, written);
        }
        out->method.mem.len += written;
        (*out->method.mem.buf)[out->method.mem.len] = '\0';
        free(msg);
        break;
    case LY_OUT_CALLBACK:
        if ((written = vasprintf(&msg, format, ap)) < 0) {
            break;
        }
        written = out->method.clb.func(out->method.clb.arg, msg, written);
        free(msg);
        break;
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    }

    if (written < 0) {
        LOGERR(NULL, LY_ESYS, "%s: writing data failed (%s).", __func__, strerror(errno));
        written = 0;
        ret = LY_ESYS;
    } else {
        if (out->type == LY_OUT_FDSTREAM) {
            /* move the original file descriptor to the end of the output file */
            lseek(out->method.fdstream.fd, 0, SEEK_END);
        }
        ret = LY_SUCCESS;
    }

    out->printed += written;
    out->func_printed += written;
    return ret;
}